

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O2

void __thiscall BpTree<int>::FindNode(BpTree<int> *this,Addr p,IndexNode<int> *Node)

{
  int BlockNum;
  ostream *poVar1;
  int FileOff;
  string local_70;
  string local_50;
  
  if ((ulong)p >> 0x20 != 0xffffffff) {
    std::__cxx11::string::string((string *)&local_50,(string *)&this->Index_FileName);
    FileOff = p.FileOff;
    BlockNum = Buffer::Find(&blocks,&local_50,FileOff);
    std::__cxx11::string::~string((string *)&local_50);
    if (BlockNum == -1) {
      std::__cxx11::string::string((string *)&local_70,(string *)&this->Index_FileName);
      BlockNum = Buffer::Allocate(&blocks,&local_70,FileOff);
      std::__cxx11::string::~string((string *)&local_70);
    }
    (Node->self).BlockNum = BlockNum;
    (Node->self).FileOff = FileOff;
    Block2Node(this,BlockNum,Node);
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Wrong address!");
  std::endl<char,std::char_traits<char>>(poVar1);
  system("pause");
  exit(1);
}

Assistant:

void BpTree<K>::FindNode(Addr p, IndexNode<K>& Node) {
	if (p.FileOff == -1) {
		cout << "Wrong address!" << endl;
		system("pause");
		exit(1);
	}
	int BlockNum = blocks.Find(this->Index_FileName, p.FileOff);		//���Ҹÿ��Ƿ�����buffer����
	if (BlockNum == -1) {
		BlockNum = blocks.Allocate(this->Index_FileName, p.FileOff);	//���û�У�������һ��
	}
	Node.self.BlockNum = BlockNum;										//��ַp�еĿ�Ų�����
	Node.self.FileOff = p.FileOff;
	this->Block2Node(BlockNum, Node);									//��������Ϣ���ർ���㵱��
}